

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawInstancedTests.cpp
# Opt level: O1

void __thiscall
vkt::Draw::anon_unknown_1::TestVertShader::shadeVertices
          (TestVertShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  int i_1;
  long lVar2;
  int instanceNdx;
  ulong uVar3;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  Vec4 color2;
  Vec4 color;
  Vec4 position;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_98 [4];
  ulong local_88;
  VertexAttrib *local_80;
  float local_78 [4];
  Vec4 local_68;
  Vec4 local_58;
  Vec4 local_48;
  
  if (0 < numPackets) {
    local_80 = inputs + 1;
    local_88 = (ulong)(uint)numPackets;
    uVar3 = 0;
    do {
      instanceNdx = this->m_firstInstance + packets[uVar3]->instanceNdx;
      local_48.m_data[0] = 0.0;
      local_48.m_data[1] = 0.0;
      local_48.m_data[2] = 0.0;
      local_48.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_48,inputs,instanceNdx,packets[uVar3]->vertexNdx);
      local_58.m_data[0] = 0.0;
      local_58.m_data[1] = 0.0;
      local_58.m_data[2] = 0.0;
      local_58.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_58,local_80,instanceNdx,packets[uVar3]->vertexNdx);
      local_68.m_data[0] = 0.0;
      local_68.m_data[1] = 0.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_68,inputs + 2,instanceNdx,packets[uVar3]->vertexNdx);
      pVVar1 = packets[uVar3];
      local_98[0] = ((float)pVVar1->instanceNdx + (float)pVVar1->instanceNdx) /
                    (float)this->m_numInstances;
      local_98[1] = 0.0;
      local_98[2] = 0.0;
      local_98[3] = 0.0;
      local_a8 = 0;
      uStack_a0 = 0;
      lVar2 = 0;
      do {
        *(float *)((long)&local_a8 + lVar2 * 4) = local_48.m_data[lVar2] + local_98[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      *(undefined8 *)(pVVar1->position).m_data = local_a8;
      *(undefined8 *)((pVVar1->position).m_data + 2) = uStack_a0;
      local_78[0] = (float)instanceNdx / (float)this->m_numInstances;
      local_78[1] = 0.0;
      local_78[2] = 0.0;
      local_78[3] = 1.0;
      local_98[0] = 0.0;
      local_98[1] = 0.0;
      local_98[2] = 0.0;
      local_98[3] = 0.0;
      lVar2 = 0;
      do {
        local_98[lVar2] = local_58.m_data[lVar2] + local_78[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      local_a8 = 0;
      uStack_a0 = 0;
      lVar2 = 0;
      do {
        *(float *)((long)&local_a8 + lVar2 * 4) = local_98[lVar2] + local_68.m_data[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      pVVar1 = packets[uVar3];
      pVVar1->outputs[0].v.uData[0] = (deUint32)local_a8;
      pVVar1->outputs[0].v.uData[1] = local_a8._4_4_;
      pVVar1->outputs[0].v.uData[2] = (deUint32)uStack_a0;
      pVVar1->outputs[0].v.uData[3] = uStack_a0._4_4_;
      uVar3 = uVar3 + 1;
    } while (uVar3 != local_88);
  }
  return;
}

Assistant:

void shadeVertices (const rr::VertexAttrib* inputs,
						rr::VertexPacket* const* packets,
						const int numPackets) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		{
			const int		instanceNdx		= packets[packetNdx]->instanceNdx + m_firstInstance;
			const tcu::Vec4	position		= rr::readVertexAttribFloat(inputs[0], instanceNdx,	packets[packetNdx]->vertexNdx);
			const tcu::Vec4	color			= rr::readVertexAttribFloat(inputs[1], instanceNdx,	packets[packetNdx]->vertexNdx);
			const tcu::Vec4	color2			= rr::readVertexAttribFloat(inputs[2], instanceNdx, packets[packetNdx]->vertexNdx);
			packets[packetNdx]->position	= position + tcu::Vec4((float)(packets[packetNdx]->instanceNdx * 2.0 / m_numInstances), 0.0, 0.0, 0.0);
			packets[packetNdx]->outputs[0]	= color + tcu::Vec4((float)instanceNdx / (float)m_numInstances, 0.0, 0.0, 1.0) + color2;
		}
	}